

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantum.cpp
# Opt level: O2

void __thiscall quantum::QuantumComputer::extendRegister(QuantumComputer *this,int resizeAmount)

{
  ostream *poVar1;
  int iVar2;
  double dVar3;
  double local_40;
  double local_38;
  
  if (this->registerSize < resizeAmount) {
    dVar3 = ldexp(1.0,this->registerSize);
    iVar2 = (int)dVar3;
    while( true ) {
      local_38 = (double)iVar2;
      dVar3 = ldexp(1.0,resizeAmount);
      if (dVar3 <= local_38) break;
      local_40 = 0.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&this->baseVector,&local_40);
      iVar2 = iVar2 + 1;
    }
    this->registerSize = resizeAmount;
    poVar1 = std::operator<<((ostream *)&std::cout,"Register resized correctly");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Number of qubits in register: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,resizeAmount);
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"You can only resize your register, not decrease");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void quantum::QuantumComputer::extendRegister(int resizeAmount) {
    if (this->registerSize >= resizeAmount) {
        std::cout << "You can only resize your register, not decrease" << std::endl;
        return;
    }

    int sizeOfBaseVector = (int) this->baseVector.size();

    int elementsToAdd = resizeAmount - this->registerSize;
    if (elementsToAdd < 0) {
        std::cout << "Number of Qubits to add must be positive" << std::endl;
        return;
    }

    for (int i = pow(2, this->registerSize); i < pow(2, resizeAmount); i++) {
        this->baseVector.push_back(0);
    }

    this->registerSize = resizeAmount;

    std::cout << "Register resized correctly" << std::endl;
    std::cout << "Number of qubits in register: " << resizeAmount << std::endl;

}